

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O3

bool __thiscall
Object_Key_Store_Data::operator==(Object_Key_Store_Data *this,Am_Wrapper *test_value)

{
  Am_ID_Tag AVar1;
  bool bVar2;
  int iVar3;
  
  AVar1 = id;
  iVar3 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar1 == (Am_ID_Tag)iVar3) {
    if ((Object_Key_Store_Data *)test_value == this) {
      return true;
    }
    if ((Am_Slot_Key)test_value[1].refs == this->key) {
      bVar2 = Am_Object::operator==((Am_Object *)(test_value + 1),&this->object);
      return bVar2;
    }
  }
  return false;
}

Assistant:

static Am_Value
from_object_procedure(Am_Object & /*self*/)
{
  Am_Value value;
  Object_Key_Store_Data *store =
      (Object_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = (store->object).Get(store->key);
  store->Release();
  return value;
}